

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int *aNew;
  int nNew;
  int iRowidOffset;
  u8 *a;
  int i;
  int n;
  int eDetail;
  int bDummy;
  int nPos;
  u64 iDelta;
  void *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int iVar4;
  int iVar5;
  Fts5Index *p_00;
  int local_34;
  int local_30;
  u64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(*in_RDI + 0x74);
  local_30 = *(int *)(*(long *)(in_RSI + 0x10) + 0xc);
  local_34 = (int)*(undefined8 *)(in_RSI + 0x20);
  p_00 = (Fts5Index *)**(undefined8 **)(in_RSI + 0x10);
  iVar4 = 0;
  if (*(int *)(in_RSI + 0x44) < local_30) {
    local_30 = *(int *)(in_RSI + 0x44);
  }
  do {
    local_10 = 0;
    if (iVar1 == 1) {
      iVar5 = iVar4;
      iVar4 = local_34;
      if ((((local_34 < local_30) && (*(u8 *)((long)&p_00->pConfig + (long)local_34) == '\0')) &&
          (iVar4 = local_34 + 1, iVar4 < local_30)) &&
         (*(u8 *)((long)&p_00->pConfig + (long)iVar4) == '\0')) {
        iVar4 = local_34 + 2;
      }
    }
    else {
      iVar3 = fts5GetPoslistSize((u8 *)p_00,(int *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb0);
      iVar5 = iVar4;
      iVar4 = iVar3 + local_34 + -0x55555556;
    }
    local_34 = iVar4;
    if (local_30 <= local_34) goto LAB_00272057;
    bVar2 = sqlite3Fts5GetVarint((uchar *)((long)&p_00->pConfig + (long)local_34),&local_10);
    local_34 = (uint)bVar2 + local_34;
    *(u64 *)(in_RSI + 0x70) = local_10 + *(long *)(in_RSI + 0x70);
    if (*(int *)(in_RSI + 0x4c) <= iVar5) {
      in_stack_ffffffffffffffb8 = *(int *)(in_RSI + 0x4c) + 8;
      in_stack_ffffffffffffffb0 = (int *)sqlite3_realloc64(in_stack_ffffffffffffffa8,0x271fe8);
      if (in_stack_ffffffffffffffb0 == (int *)0x0) {
        *(undefined4 *)((long)in_RDI + 0x3c) = 7;
LAB_00272057:
        *(int *)(in_RSI + 0x48) = iVar5;
        fts5SegIterLoadNPos(p_00,(Fts5SegIter *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return;
      }
      *(int **)(in_RSI + 0x50) = in_stack_ffffffffffffffb0;
      *(int *)(in_RSI + 0x4c) = in_stack_ffffffffffffffb8;
    }
    iVar4 = iVar5 + 1;
    *(int *)(*(long *)(in_RSI + 0x50) + (long)iVar5 * 4) = (int)*(undefined8 *)(in_RSI + 0x20);
    *(long *)(in_RSI + 0x20) = (long)local_34;
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    u64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], &iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}